

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugLine.cpp
# Opt level: O1

LineTable * __thiscall llvm::DWARFDebugLine::getLineTable(DWARFDebugLine *this,uint64_t Offset)

{
  _Base_ptr p_Var1;
  LineTable *pLVar2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  
  p_Var4 = &(this->LineTableMap)._M_t._M_impl.super__Rb_tree_header;
  p_Var3 = (this->LineTableMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var1 = &p_Var4->_M_header;
  for (; p_Var3 != (_Base_ptr)0x0; p_Var3 = (&p_Var3->_M_left)[*(ulong *)(p_Var3 + 1) < Offset]) {
    if (*(ulong *)(p_Var3 + 1) >= Offset) {
      p_Var1 = p_Var3;
    }
  }
  p_Var3 = &p_Var4->_M_header;
  if (((_Rb_tree_header *)p_Var1 != p_Var4) && (p_Var3 = p_Var1, Offset < *(ulong *)(p_Var1 + 1))) {
    p_Var3 = &p_Var4->_M_header;
  }
  pLVar2 = (LineTable *)0x0;
  if ((_Rb_tree_header *)p_Var3 != p_Var4) {
    pLVar2 = (LineTable *)&p_Var3[1]._M_parent;
  }
  return pLVar2;
}

Assistant:

const DWARFDebugLine::LineTable *
DWARFDebugLine::getLineTable(uint64_t Offset) const {
  LineTableConstIter Pos = LineTableMap.find(Offset);
  if (Pos != LineTableMap.end())
    return &Pos->second;
  return nullptr;
}